

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_window.cpp
# Opt level: O1

Am_Object generate_search_group
                    (Am_Value_List *pos_slots,char *main_label,int *current_y,bool main_check_box,
                    Am_Value_List *slots_to_item,Am_Value_List *slots_values)

{
  Am_Object_Data *pAVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  Am_Object *pAVar5;
  Am_Object *pAVar6;
  Am_Constraint *pAVar7;
  Am_Wrapper *pAVar8;
  Am_Value *pAVar9;
  char *value;
  ostream *poVar10;
  undefined7 in_register_00000009;
  int *piVar11;
  Am_Slot_Key AVar12;
  int iVar13;
  Am_Am_Slot_Key this_slot;
  Am_Value this_value;
  Am_Object this_item;
  Am_Value_List sub_parts;
  Am_Am_Slot_Key local_c2;
  Am_Formula local_c0;
  Am_Value_List local_b0;
  Am_Object_Data *local_a0;
  Am_Value_List *local_98;
  Am_Object local_90;
  Am_Value local_88;
  Am_Object local_78;
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Value_List local_50;
  int *local_40;
  Am_Value_List *local_38;
  
  piVar11 = (int *)CONCAT71(in_register_00000009,main_check_box);
  pos_slots->data = (Am_Value_List_Data *)0x0;
  local_c2.value = 0;
  local_90.data = (Am_Object_Data *)0x0;
  local_a0 = (Am_Object_Data *)pos_slots;
  local_98 = (Am_Value_List *)main_label;
  local_38 = slots_values;
  Am_Value_List::Am_Value_List(&local_50);
  Am_Object::Create((Am_Object *)&local_88,(char *)&Am_Group);
  pAVar5 = Am_Object::Set((Am_Object *)&local_88,100,5,0);
  pAVar5 = Am_Object::Set(pAVar5,0x65,*piVar11,0);
  pAVar5 = Am_Object::Set(pAVar5,0x66,0x1b8,0);
  Am_Object::Create(&local_68,(char *)&Am_Border_Rectangle);
  pAVar6 = Am_Object::Set(&local_68,100,0,0);
  pAVar6 = Am_Object::Set(pAVar6,0x65,0,0);
  Am_From_Owner((Am_Slot_Key)&local_c0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_(&local_c0);
  pAVar6 = Am_Object::Set(pAVar6,0x66,pAVar7,0);
  Am_From_Owner((Am_Slot_Key)&local_b0);
  pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&local_b0);
  pAVar6 = Am_Object::Set(pAVar6,0x67,pAVar7,0);
  pAVar6 = Am_Object::Set(pAVar6,0x172,0,0);
  pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Default_Color);
  pAVar6 = Am_Object::Set(pAVar6,0x6a,pAVar8,0);
  Am_Object::Am_Object(&local_60,pAVar6);
  pAVar5 = Am_Object::Add_Part(pAVar5,&local_60,true,0);
  Am_Object::operator=((Am_Object *)local_a0,pAVar5);
  Am_Object::~Am_Object(&local_60);
  Am_Formula::~Am_Formula((Am_Formula *)&local_b0);
  Am_Formula::~Am_Formula(&local_c0);
  Am_Object::~Am_Object(&local_68);
  Am_Object::~Am_Object((Am_Object *)&local_88);
  AVar12 = Am_MAIN_BUTTON;
  local_40 = piVar11;
  if ((char)slots_to_item == '\0') {
    Am_Object::Create((Am_Object *)&local_c0,(char *)&Am_Text);
    pAVar5 = Am_Object::Set((Am_Object *)&local_c0,100,10,0);
    pAVar5 = Am_Object::Set(pAVar5,0x65,10,0);
    pAVar5 = Am_Object::Set(pAVar5,0xab,(char *)current_y,0);
    pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
    pAVar5 = Am_Object::Set(pAVar5,0xac,pAVar8,0);
    pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_Black);
    pAVar5 = Am_Object::Set(pAVar5,0x6b,pAVar8,0);
    pAVar8 = Am_Style::operator_cast_to_Am_Wrapper_(&Am_No_Style);
    pAVar5 = Am_Object::Set(pAVar5,0x6a,pAVar8,0);
    Am_Object::Am_Object(&local_78,pAVar5);
    Am_Object::Add_Part((Am_Object *)local_a0,&local_78,true,0);
    Am_Object::~Am_Object(&local_78);
    Am_Object::~Am_Object((Am_Object *)&local_c0);
    iVar3 = 0x14;
  }
  else {
    Am_Object::Create((Am_Object *)&local_c0,(char *)&search_item_proto);
    pAVar5 = Am_Object::Set((Am_Object *)&local_c0,100,10,0);
    pAVar5 = Am_Object::Set(pAVar5,0x65,5,0);
    pAVar5 = Am_Object::Set(pAVar5,0x150,(char *)current_y,0);
    pAVar5 = Am_Object::Set(pAVar5,0xcc,true,0);
    Am_Object::Am_Object(&local_70,pAVar5);
    pAVar1 = local_a0;
    Am_Object::Add_Part((Am_Object *)local_a0,AVar12,&local_70,0);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object((Am_Object *)&local_c0);
    Am_Object::Get_Object((Am_Object *)&local_b0,(Am_Slot_Key)pAVar1,(ulong)Am_MAIN_BUTTON);
    Am_Object::Get_Object((Am_Object *)&local_c0,(Am_Slot_Key)&local_b0,(ulong)Am_USE_ITEM);
    pAVar9 = Am_Object::Get((Am_Object *)&local_c0,0x66,0);
    iVar3 = Am_Value::operator_cast_to_int(pAVar9);
    Am_Object::~Am_Object((Am_Object *)&local_c0);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    Am_Object::Get_Object((Am_Object *)&local_c0,(Am_Slot_Key)local_a0,(ulong)Am_MAIN_BUTTON);
    Am_Object::Set((Am_Object *)&local_c0,0x11d,iVar3,0);
    Am_Object::~Am_Object((Am_Object *)&local_c0);
    Am_Object::Get_Object((Am_Object *)&local_b0,(Am_Slot_Key)local_a0,(ulong)Am_MAIN_BUTTON);
    Am_Object::Get_Object((Am_Object *)&local_c0,(Am_Slot_Key)&local_b0,(ulong)Am_USE_ITEM);
    pAVar8 = Am_Font::operator_cast_to_Am_Wrapper_(&search_bold_font);
    Am_Object::Set((Am_Object *)&local_c0,0xac,pAVar8,0);
    Am_Object::~Am_Object((Am_Object *)&local_c0);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    iVar3 = 0x23;
  }
  local_c0.super_Am_Registered_Type._vptr_Am_Registered_Type._0_2_ = 0;
  local_c0.data = (Am_Formula_Data *)0x0;
  Am_Value_List::Start(local_98);
  iVar13 = 0;
  while( true ) {
    bVar2 = Am_Value_List::Last(local_98);
    if (bVar2) {
      Am_Value_List::Start(&local_50);
      while( true ) {
        bVar2 = Am_Value_List::Last(&local_50);
        if (bVar2) break;
        pAVar9 = Am_Value_List::Get(&local_50);
        Am_Object::operator=(&local_90,pAVar9);
        Am_Object::Set(&local_90,0x11d,iVar13 + 2,0);
        Am_Value_List::Next(&local_50);
      }
      Am_Object::Set((Am_Object *)local_a0,0x67,iVar3,0);
      *local_40 = *local_40 + iVar3;
      Am_Value::~Am_Value((Am_Value *)&local_c0);
      Am_Value_List::~Am_Value_List(&local_50);
      Am_Object::~Am_Object(&local_90);
      return (Am_Object)local_a0;
    }
    pAVar9 = Am_Value_List::Get(local_98);
    Am_Am_Slot_Key::Am_Am_Slot_Key((Am_Am_Slot_Key *)&local_b0,pAVar9);
    local_c2.value = (Am_Slot_Key)local_b0.data;
    value = Am_Get_Slot_Name((Am_Slot_Key)local_b0.data);
    Am_Object::Create((Am_Object *)&local_b0,(char *)&search_item_proto);
    pAVar5 = Am_Object::Set((Am_Object *)&local_b0,100,0x1e,0);
    pAVar5 = Am_Object::Set(pAVar5,0x65,iVar3,0);
    pAVar5 = Am_Object::Set(pAVar5,0x150,value,0);
    Am_Object::operator=(&local_90,pAVar5);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    local_88.value.long_value._2_6_ = 0;
    local_88.value.long_value._0_2_ = local_c2.value;
    local_88.type = 0x4015;
    Am_Value_List::Assoc_2(&local_b0,(Am_Value *)this_value._0_8_);
    Am_Value::operator=((Am_Value *)&local_c0,(Am_Value *)&local_b0);
    Am_Value::~Am_Value((Am_Value *)&local_b0);
    Am_Value::~Am_Value(&local_88);
    bVar2 = Am_Value::Exists((Am_Value *)&local_c0);
    if (!bVar2) break;
    AVar12 = (Am_Slot_Key)&local_90;
    Am_Object::Get_Object((Am_Object *)&local_b0,AVar12,(ulong)Am_ITEM_VALUE);
    Am_Object::Set((Am_Object *)&local_b0,0xfa,(Am_Value *)&local_c0,0);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    local_b0.item = (Am_List_Item *)(ulong)local_c2.value;
    local_b0.data._0_2_ = 0x4015;
    pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
    Am_Assoc::Am_Assoc((Am_Assoc *)&local_88,(Am_Value *)&local_b0,pAVar8);
    pAVar8 = Am_Assoc::operator_cast_to_Am_Wrapper_((Am_Assoc *)&local_88);
    Am_Value_List::Add(local_38,pAVar8,Am_TAIL,true);
    Am_Assoc::~Am_Assoc((Am_Assoc *)&local_88);
    Am_Value::~Am_Value((Am_Value *)&local_b0);
    pAVar8 = Am_Object::operator_cast_to_Am_Wrapper_(&local_90);
    Am_Value_List::Add(&local_50,pAVar8,Am_TAIL,true);
    Am_Object::Get_Object((Am_Object *)&local_b0,AVar12,(ulong)Am_USE_ITEM);
    pAVar9 = Am_Object::Get((Am_Object *)&local_b0,0x66,0);
    iVar4 = Am_Value::operator_cast_to_int(pAVar9);
    Am_Object::~Am_Object((Am_Object *)&local_b0);
    if (iVar13 < iVar4) {
      iVar13 = iVar4;
    }
    Am_Object::Am_Object(&local_58,&local_90);
    Am_Object::Add_Part((Am_Object *)local_a0,&local_58,true,0);
    Am_Object::~Am_Object(&local_58);
    iVar3 = iVar3 + 0x1e;
    Am_Value_List::Next(local_98);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"** Amulet_Error: ",0x11)
  ;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"Lost value for key ",0x13);
  poVar10 = operator<<((ostream *)&std::cerr,&local_c2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," from ",6);
  poVar10 = operator<<(poVar10,(Am_Value_List *)this_value._0_8_);
  std::endl<char,std::char_traits<char>>(poVar10);
  Am_Error();
}

Assistant:

Am_Object
generate_search_group(Am_Value_List &pos_slots, const char *main_label,
                      int &current_y, bool main_check_box,
                      Am_Value_List &slots_to_item, Am_Value_List &slots_values)
{
  Am_Object group;
  Am_Am_Slot_Key this_slot;
  const char *s;
  Am_Object this_item;
  int max_item_width = 0;
  int this_w;
  int this_y = 0;
  Am_Value_List sub_parts;
  group = Am_Group.Create()
              .Set(Am_LEFT, 5)
              .Set(Am_TOP, current_y)
              .Set(Am_WIDTH, WINDOW_WIDTH - 10)
              .Add_Part(Am_Border_Rectangle.Create()
                            .Set(Am_LEFT, 0)
                            .Set(Am_TOP, 0)
                            .Set(Am_WIDTH, Am_From_Owner(Am_WIDTH))
                            .Set(Am_HEIGHT, Am_From_Owner(Am_HEIGHT))
                            .Set(Am_SELECTED, 0)
                            .Set(Am_FILL_STYLE, Am_Default_Color));

  if (main_check_box) {
    group.Add_Part(Am_MAIN_BUTTON, search_item_proto.Create()
                                       .Set(Am_LEFT, 10)
                                       .Set(Am_TOP, 5)
                                       .Set(Am_LABEL, main_label)
                                       .Set(Am_ACTIVE, true));
    max_item_width =
        group.Get_Object(Am_MAIN_BUTTON).Get_Object(Am_USE_ITEM).Get(Am_WIDTH);
    group.Get_Object(Am_MAIN_BUTTON).Set(Am_X_OFFSET, max_item_width);
    group.Get_Object(Am_MAIN_BUTTON)
        .Get_Object(Am_USE_ITEM)
        .Set(Am_FONT, search_bold_font);
    this_y += ITEM_SIZE + 5;
  } else {
    group.Add_Part(Am_Text.Create()
                       .Set(Am_LEFT, 2 * OFFSET)
                       .Set(Am_TOP, 2 * OFFSET)
                       .Set(Am_TEXT, main_label)
                       .Set(Am_FONT, search_bold_font)
                       .Set(Am_LINE_STYLE, Am_Black)
                       .Set(Am_FILL_STYLE, Am_No_Style));
    this_y += 20;
  }
  max_item_width = 0;
  Am_Value this_value;
  for (pos_slots.Start(); !pos_slots.Last(); pos_slots.Next()) {
    this_slot = Am_Am_Slot_Key(pos_slots.Get());
    s = Am_Get_Slot_Name(this_slot);
    this_item = search_item_proto.Create()
                    .Set(Am_LEFT, INDENT_OFFSET)
                    .Set(Am_TOP, this_y)
                    .Set(Am_LABEL, s);
    this_value = slots_values.Assoc_2(this_slot);
    if (!this_value.Exists())
      Am_ERROR("Lost value for key " << this_slot << " from " << slots_values);
    this_item.Get_Object(Am_ITEM_VALUE).Set(Am_VALUES, this_value);
    slots_to_item.Add(Am_Assoc(this_slot, this_item));
    sub_parts.Add(this_item);
    this_y += ITEM_SIZE;
    this_w = this_item.Get_Object(Am_USE_ITEM).Get(Am_WIDTH);
    if (this_w > max_item_width)
      max_item_width = this_w;
    group.Add_Part(this_item);
  }
  for (sub_parts.Start(); !sub_parts.Last(); sub_parts.Next()) {
    this_item = sub_parts.Get();
    this_item.Set(Am_X_OFFSET, max_item_width + 2);
  }
  group.Set(Am_HEIGHT, this_y);
  current_y += this_y;
  return group;
}